

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMapTestCase.cpp
# Opt level: O3

void __thiscall
SuiteFieldMapTests::TestsetField_16FieldsAlreadyExist_fieldSet::RunImpl
          (TestsetField_16FieldsAlreadyExist_fieldSet *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  FieldBase expectedTag18;
  FieldMap fieldMap;
  FieldBase actualTag18;
  undefined1 local_170 [12];
  undefined4 uStack_164;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_160;
  int local_150 [4];
  _Alloc_hider local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  size_t local_120;
  int local_118;
  TestDetails local_110;
  int local_f0 [2];
  FieldMap local_e8 [112];
  FieldBase local_78;
  
  local_170._0_4_ = normal;
  local_170._4_4_ = 0;
  local_170._8_4_ = 0;
  uStack_164 = 0;
  aStack_160._M_allocated_capacity._0_4_ = 0;
  aStack_160._M_allocated_capacity._4_4_ = 0;
  aStack_160._8_4_ = 0;
  FIX::FieldMap::FieldMap(local_e8,(message_order *)local_170);
  FIX::shared_array<int>::release((shared_array<int> *)(local_170 + 8));
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field1","");
  FIX::FieldMap::setField(local_e8,1,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field2","");
  FIX::FieldMap::setField(local_e8,2,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field3","");
  FIX::FieldMap::setField(local_e8,3,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field4","");
  FIX::FieldMap::setField(local_e8,4,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field5","");
  FIX::FieldMap::setField(local_e8,5,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field6","");
  FIX::FieldMap::setField(local_e8,6,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field7","");
  FIX::FieldMap::setField(local_e8,7,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field8","");
  FIX::FieldMap::setField(local_e8,8,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field9","");
  FIX::FieldMap::setField(local_e8,9,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field10","");
  FIX::FieldMap::setField(local_e8,10,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field11","");
  FIX::FieldMap::setField(local_e8,0xb,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field12","");
  FIX::FieldMap::setField(local_e8,0xc,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field13","");
  FIX::FieldMap::setField(local_e8,0xd,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field14","");
  FIX::FieldMap::setField(local_e8,0xe,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field15","");
  FIX::FieldMap::setField(local_e8,0xf,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field16","");
  FIX::FieldMap::setField(local_e8,0x10,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field17","");
  FIX::FieldMap::setField(local_e8,0x11,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_170._0_8_ = &aStack_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"field18","");
  FIX::FieldMap::setField(local_e8,0x12,(string *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._0_8_ != &aStack_160) {
    operator_delete((void *)local_170._0_8_,
                    CONCAT44(aStack_160._M_allocated_capacity._4_4_,
                             aStack_160._M_allocated_capacity._0_4_) + 1);
  }
  local_78._vptr_FieldBase = (_func_int **)&local_78.m_string;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"field18_new","");
  local_170._0_4_ = 0x323d68;
  local_170._4_4_ = 0;
  local_170._8_4_ = 0x12;
  aStack_160._M_allocated_capacity = (size_type)local_150;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&aStack_160,local_78._vptr_FieldBase,
             (undefined1 *)
             ((long)&((_Alloc_hider *)local_78._vptr_FieldBase)->_M_p +
             CONCAT44(local_78._12_4_,local_78.m_tag)));
  local_140._M_p = (pointer)&local_130;
  local_138 = 0;
  local_130._M_local_buf[0] = '\0';
  local_120 = 0;
  local_118 = 0;
  if ((string *)local_78._vptr_FieldBase != &local_78.m_string) {
    operator_delete(local_78._vptr_FieldBase,(ulong)(local_78.m_string._M_dataplus._M_p + 1));
  }
  FIX::FieldMap::setField(local_e8,(FieldBase *)local_170,true);
  local_110.suiteName = (char *)&local_110.filename;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"");
  local_78._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00323d68;
  local_78.m_tag = 0x12;
  local_78.m_string._M_dataplus._M_p = (pointer)&local_78.m_string.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78.m_string,local_110.suiteName,
             local_110.testName + (long)local_110.suiteName);
  local_78.m_data._M_dataplus._M_p = (pointer)&local_78.m_data.field_2;
  local_78.m_data._M_string_length = 0;
  local_78.m_data.field_2._M_local_buf[0] = '\0';
  local_78.m_metrics.m_length = 0;
  local_78.m_metrics.m_checksum = 0;
  if ((char **)local_110.suiteName != &local_110.filename) {
    operator_delete(local_110.suiteName,(ulong)(local_110.filename + 1));
  }
  FIX::FieldMap::getFieldIfSet(local_e8,&local_78);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_f0[1] = 0x12;
  local_f0[0] = local_78.m_tag;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_110,*ppTVar3,0x99);
  UnitTest::CheckEqual<int,int>(pTVar1,local_f0 + 1,local_f0,&local_110);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_110,*ppTVar3,0x9a);
  UnitTest::CheckEqual<char[12],std::__cxx11::string>
            (pTVar1,(char (*) [12])"field18_new",&local_78.m_string,&local_110);
  FIX::FieldBase::~FieldBase(&local_78);
  FIX::FieldBase::~FieldBase((FieldBase *)local_170);
  FIX::FieldMap::~FieldMap(local_e8);
  return;
}

Assistant:

TEST(setField_16FieldsAlreadyExist_fieldSet)
{
    FieldMap fieldMap;
    fieldMap.setField(1, "field1");
    fieldMap.setField(2, "field2");
    fieldMap.setField(3, "field3");
    fieldMap.setField(4, "field4");
    fieldMap.setField(5, "field5");
    fieldMap.setField(6, "field6");

    fieldMap.setField(7, "field7");
    fieldMap.setField(8, "field8");
    fieldMap.setField(9, "field9");
    fieldMap.setField(10, "field10");
    fieldMap.setField(11, "field11");
    fieldMap.setField(12, "field12");
    fieldMap.setField(13, "field13");
    fieldMap.setField(14, "field14");
    fieldMap.setField(15, "field15");
    fieldMap.setField(16, "field16");
    fieldMap.setField(17, "field17");
    fieldMap.setField(18, "field18");

    FieldBase expectedTag18(18, "field18_new");

    fieldMap.setField(expectedTag18);

    FieldBase actualTag18(18, "");
    fieldMap.getFieldIfSet(actualTag18);

    CHECK_EQUAL(18, actualTag18.getTag());
    CHECK_EQUAL("field18_new", actualTag18.getString());
}